

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_flags nk_edit_buffer(nk_context *ctx,nk_flags flags,nk_text_edit *edit,nk_plugin_filter filter)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  nk_window *pnVar4;
  nk_plugin_paste p_Var5;
  nk_widget_layout_states nVar6;
  nk_flags nVar7;
  code *filter_00;
  nk_context *in;
  uchar uVar8;
  int iVar9;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5bae,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (edit == (nk_text_edit *)0x0) {
    __assert_fail("edit",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5baf,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5bb0,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (pnVar4->layout != (nk_panel *)0x0) {
    nVar6 = nk_widget(&bounds,ctx);
    if (nVar6 == NK_WIDGET_INVALID) {
      nVar7 = 0;
    }
    else {
      uVar2 = pnVar4->layout->flags;
      uVar3 = (pnVar4->edit).seq;
      (pnVar4->edit).seq = uVar3 + 1;
      iVar9 = (pnVar4->edit).active;
      if ((iVar9 == 0) || (uVar3 != (pnVar4->edit).name)) {
        iVar9 = 0;
      }
      else {
        if ((flags & 0x10) != 0) {
          edit->cursor = (edit->string).len;
        }
        if ((flags & 0x20) == 0) {
          edit->select_start = edit->cursor;
          edit->select_end = edit->cursor;
        }
        if ((flags & 0x40) != 0) {
          (edit->clip).copy = (ctx->clip).copy;
          p_Var5 = (ctx->clip).paste;
          (edit->clip).userdata = (ctx->clip).userdata;
          (edit->clip).paste = p_Var5;
          iVar9 = (pnVar4->edit).active;
        }
      }
      uVar8 = (uchar)iVar9;
      edit->active = uVar8;
      filter_00 = nk_filter_default;
      if (filter != (nk_plugin_filter)0x0) {
        filter_00 = filter;
      }
      edit->mode = (pnVar4->edit).mode;
      in = (nk_context *)0x0;
      if ((flags & 1) == 0 && (uVar2 & 0x1000) == 0) {
        in = ctx;
      }
      nVar7 = nk_do_edit(&ctx->last_widget_state,&pnVar4->buffer,bounds,flags,filter_00,edit,
                         &(ctx->style).edit,&in->input,(ctx->style).font);
      if ((ctx->last_widget_state & 0x10) != 0) {
        (ctx->style).cursor_active = (ctx->style).cursors[1];
      }
      uVar1 = edit->active;
      if ((uVar1 == '\0') || (uVar8 == uVar1)) {
        if (uVar8 != '\0' && uVar1 == '\0') {
          (pnVar4->edit).active = 0;
        }
      }
      else {
        (pnVar4->edit).active = 1;
        (pnVar4->edit).name = uVar3;
      }
    }
    return nVar7;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5bb1,
                "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
               );
}

Assistant:

NK_API nk_flags
nk_edit_buffer(struct nk_context *ctx, nk_flags flags,
    struct nk_text_edit *edit, nk_plugin_filter filter)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    nk_flags ret_flags = 0;
    unsigned char prev_state;
    nk_hash hash;

    /* make sure correct values */
    NK_ASSERT(ctx);
    NK_ASSERT(edit);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    state = nk_widget(&bounds, ctx);
    if (!state) return state;
    in = (win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    /* check if edit is currently hot item */
    hash = win->edit.seq++;
    if (win->edit.active && hash == win->edit.name) {
        if (flags & NK_EDIT_NO_CURSOR)
            edit->cursor = edit->string.len;
        if (!(flags & NK_EDIT_SELECTABLE)) {
            edit->select_start = edit->cursor;
            edit->select_end = edit->cursor;
        }
        if (flags & NK_EDIT_CLIPBOARD)
            edit->clip = ctx->clip;
        edit->active = (unsigned char)win->edit.active;
    } else edit->active = nk_false;
    edit->mode = win->edit.mode;

    filter = (!filter) ? nk_filter_default: filter;
    prev_state = (unsigned char)edit->active;
    in = (flags & NK_EDIT_READ_ONLY) ? 0: in;
    ret_flags = nk_do_edit(&ctx->last_widget_state, &win->buffer, bounds, flags,
                    filter, edit, &style->edit, in, style->font);

    if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_TEXT];
    if (edit->active && prev_state != edit->active) {
        /* current edit is now hot */
        win->edit.active = nk_true;
        win->edit.name = hash;
    } else if (prev_state && !edit->active) {
        /* current edit is now cold */
        win->edit.active = nk_false;
    } return ret_flags;
}